

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * pcache1Alloc(int nByte)

{
  long lVar1;
  bool bVar2;
  PgFreeslot *pPVar3;
  int iVar4;
  void *pvVar5;
  sqlite3StatValueType newValue;
  u64 n;
  
  n = (u64)nByte;
  if (nByte <= pcache1_g.szSlot) {
    if (pcache1_g.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(pcache1_g.mutex);
    }
    pPVar3 = pcache1_g.pFree;
    if (pcache1_g.pFree != (PgFreeslot *)0x0) {
      pcache1_g.pFree = (pcache1_g.pFree)->pNext;
      iVar4 = pcache1_g.nFreeSlot + -1;
      pcache1_g.bUnderPressure = (int)(pcache1_g.nFreeSlot <= pcache1_g.nReserve);
      if (sqlite3Stat.mxValue[7] < (long)n) {
        sqlite3Stat.mxValue[7] = n;
      }
      lVar1 = sqlite3Stat.nowValue[1] + 1;
      bVar2 = sqlite3Stat.mxValue[1] <= sqlite3Stat.nowValue[1];
      sqlite3Stat.nowValue[1] = lVar1;
      pcache1_g.nFreeSlot = iVar4;
      if (bVar2) {
        sqlite3Stat.mxValue[1] = lVar1;
      }
    }
    if (pcache1_g.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(pcache1_g.mutex);
    }
    if (pPVar3 != (PgFreeslot *)0x0) {
      return pPVar3;
    }
  }
  pvVar5 = sqlite3Malloc(n);
  if (pvVar5 == (void *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    iVar4 = (*sqlite3Config.m.xSize)(pvVar5);
    if (pcache1_g.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(pcache1_g.mutex);
    }
    if (sqlite3Stat.mxValue[7] < (long)n) {
      sqlite3Stat.mxValue[7] = n;
    }
    sqlite3Stat.nowValue[2] = iVar4 + sqlite3Stat.nowValue[2];
    if (sqlite3Stat.mxValue[2] < sqlite3Stat.nowValue[2]) {
      sqlite3Stat.mxValue[2] = sqlite3Stat.nowValue[2];
    }
    if (pcache1_g.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(pcache1_g.mutex);
    }
  }
  return pvVar5;
}

Assistant:

static void *pcache1Alloc(int nByte){
  void *p = 0;
  assert( sqlite3_mutex_notheld(pcache1.grp.mutex) );
  if( nByte<=pcache1.szSlot ){
    sqlite3_mutex_enter(pcache1.mutex);
    p = (PgHdr1 *)pcache1.pFree;
    if( p ){
      pcache1.pFree = pcache1.pFree->pNext;
      pcache1.nFreeSlot--;
      pcache1.bUnderPressure = pcache1.nFreeSlot<pcache1.nReserve;
      assert( pcache1.nFreeSlot>=0 );
      sqlite3StatusHighwater(SQLITE_STATUS_PAGECACHE_SIZE, nByte);
      sqlite3StatusUp(SQLITE_STATUS_PAGECACHE_USED, 1);
    }
    sqlite3_mutex_leave(pcache1.mutex);
  }
  if( p==0 ){
    /* Memory is not available in the SQLITE_CONFIG_PAGECACHE pool.  Get
    ** it from sqlite3Malloc instead.
    */
    p = sqlite3Malloc(nByte);
#ifndef SQLITE_DISABLE_PAGECACHE_OVERFLOW_STATS
    if( p ){
      int sz = sqlite3MallocSize(p);
      sqlite3_mutex_enter(pcache1.mutex);
      sqlite3StatusHighwater(SQLITE_STATUS_PAGECACHE_SIZE, nByte);
      sqlite3StatusUp(SQLITE_STATUS_PAGECACHE_OVERFLOW, sz);
      sqlite3_mutex_leave(pcache1.mutex);
    }
#endif
    sqlite3MemdebugSetType(p, MEMTYPE_PCACHE);
  }
  return p;
}